

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

void nes_set_pan_mame(void *chip,INT16 *PanVals)

{
  undefined8 in_RAX;
  INT32 fdsPan [2];
  undefined8 local_18;
  
  local_18 = in_RAX;
  nesapu_set_panning(*(void **)((long)chip + 8),*PanVals,PanVals[1],PanVals[2],PanVals[3],PanVals[4]
                    );
  if (*(long *)((long)chip + 0x18) != 0) {
    Panning_Calculate((INT32 *)&local_18,PanVals[5]);
    NES_FDS_SetStereoMix
              (*(void **)((long)chip + 0x18),0,(INT16)((int)local_18 + 0x100U >> 9),
               (INT16)(local_18._4_4_ + 0x100U >> 9));
  }
  return;
}

Assistant:

static void nes_set_pan_mame(void* chip, const INT16* PanVals)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	nesapu_set_panning(info->chip_apu, PanVals[0], PanVals[1], PanVals[2], PanVals[3], PanVals[4]);
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
	{
		INT32 fdsPan[2];
		Panning_Calculate(fdsPan, PanVals[5]);
		NES_FDS_SetStereoMix(info->chip_fds, 0, PAN_EMU2NSF(fdsPan[0]), PAN_EMU2NSF(fdsPan[1]));
	}
#endif
	
	return;
}